

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O3

void __thiscall
Employee::Employee(Employee *this,string *name,string *id,Address *address,int h,int ph,int wtd,
                  int wd)

{
  pointer pcVar1;
  int iVar2;
  long *local_50 [2];
  long local_40 [2];
  
  Person::Person(&this->super_Person,name,id,address);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00109d68;
  this->hourWork = h;
  this->salaryPerHour = ph;
  this->workToDo = wtd;
  this->workDone = wd;
  pcVar1 = (id->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar1,pcVar1 + id->_M_string_length)
  ;
  iVar2 = (**(this->super_Person)._vptr_Person)(this,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar2 != '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid input");
  exit(1);
}

Assistant:

Employee::Employee(const string &name, const string &id, const Address &address, int h, int ph, int wtd, int wd) :
        Person(name, id, address) {
    this->hourWork = h;
    this->salaryPerHour = ph;
    this->workToDo = wtd;
    this->workDone = wd;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid input";
        exit(1);
    }

}